

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O2

size_t HUF_decompress1X_usingDTable
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable)

{
  undefined1 *puVar1;
  HUF_DTable HVar2;
  BIT_DStream_status BVar3;
  int iVar4;
  size_t sVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int in_R9D;
  BIT_DStream_t BStack_58;
  
  if (*(char *)((long)DTable + 1) == '\0') {
    HVar2 = *DTable;
    sVar5 = BIT_initDStream(&BStack_58,cSrc,cSrcSize);
    if (sVar5 < 0xffffffffffffff89) {
      puVar1 = (undefined1 *)((long)dst + maxDstSize);
      bVar6 = -(char)(HVar2 >> 0x10) & 0x3f;
      while ((BVar3 = BIT_reloadDStream(&BStack_58), dst < puVar1 + -3 &&
             (BVar3 == BIT_DStream_unfinished))) {
        uVar7 = (BStack_58.bitContainer << ((byte)BStack_58.bitsConsumed & 0x3f)) >> bVar6;
        iVar4 = *(byte *)((long)DTable + uVar7 * 2 + 5) + BStack_58.bitsConsumed;
        uVar9 = (BStack_58.bitContainer << ((byte)iVar4 & 0x3f)) >> bVar6;
        *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar7 * 2 + 4);
        iVar4 = (uint)*(byte *)((long)DTable + uVar9 * 2 + 5) + iVar4;
        uVar8 = (BStack_58.bitContainer << ((byte)iVar4 & 0x3f)) >> bVar6;
        *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar9 * 2 + 4);
        iVar4 = (uint)*(byte *)((long)DTable + uVar8 * 2 + 5) + iVar4;
        uVar7 = (BStack_58.bitContainer << ((byte)iVar4 & 0x3f)) >> bVar6;
        *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar8 * 2 + 4);
        BStack_58.bitsConsumed = (uint)*(byte *)((long)DTable + uVar7 * 2 + 5) + iVar4;
        *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar7 * 2 + 4);
        dst = (void *)((long)dst + 4);
      }
      for (; dst < puVar1; dst = (void *)((long)dst + 1)) {
        uVar7 = (BStack_58.bitContainer << ((byte)BStack_58.bitsConsumed & 0x3f)) >> bVar6;
        BStack_58.bitsConsumed = BStack_58.bitsConsumed + *(byte *)((long)DTable + uVar7 * 2 + 5);
        *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar7 * 2 + 4);
      }
      if (BStack_58.bitsConsumed != 0x40) {
        maxDstSize = 0xffffffffffffffec;
      }
      sVar5 = maxDstSize;
      if (BStack_58.ptr != BStack_58.start) {
        sVar5 = 0xffffffffffffffec;
      }
    }
    return sVar5;
  }
  sVar5 = HUF_decompress1X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,in_R9D);
  return sVar5;
}

Assistant:

size_t HUF_decompress1X_usingDTable(void* dst, size_t maxDstSize,
                                    const void* cSrc, size_t cSrcSize,
                                    const HUF_DTable* DTable)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress1X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress1X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0);
#else
    return dtd.tableType ? HUF_decompress1X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0) :
                           HUF_decompress1X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0);
#endif
}